

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

bool __thiscall asl::InetAddress::set(InetAddress *this,String *host)

{
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  HostPort hp;
  String thehost;
  String local_38;
  
  String::String(&thehost,host);
  iVar3 = String::indexOf(host,':',0);
  __src = &host->field_2;
  paVar4 = __src;
  if (host->_size != 0) {
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(host->field_2)._str;
  }
  if ((-1 < iVar3) && (paVar4->_space[0] != '[')) {
    iVar3 = String::indexOf(host,':',iVar3 + 1);
    if (0 < iVar3) {
      operator+(&local_38,'[',host);
      String::operator+(&hp.host,&local_38,']');
      String::operator=(&thehost,&hp.host);
      String::~String(&hp.host);
      String::~String(&local_38);
    }
  }
  parseHostPort(&hp,&thehost);
  if (hp.port._len < 1) {
    bVar2 = String::contains(&hp.host,'/');
    if (!bVar2) {
      bVar2 = String::contains(&hp.host,'\\');
      if (!bVar2) goto LAB_0012351c;
    }
    Array<unsigned_char>::resize(&this->_data,0x6e);
    puVar1 = (this->_data)._a;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    if (host->_size != 0) {
      __src = (anon_union_16_2_78e7fdac_for_String_2 *)(host->field_2)._str;
    }
    iVar3 = 0x6b;
    if (host->_len < 0x6b) {
      iVar3 = host->_len;
    }
    memcpy(puVar1 + 2,__src,(long)(iVar3 + 1));
    puVar1[0x6d] = '\0';
    this->_type = LOCAL;
    bVar2 = true;
  }
  else {
LAB_0012351c:
    iVar3 = String::operator_cast_to_int(&hp.port);
    bVar2 = set(this,&hp.host,iVar3);
  }
  HostPort::~HostPort(&hp);
  String::~String(&thehost);
  return bVar2;
}

Assistant:

bool InetAddress::set(const String& host)
{
	String thehost = host;
	int c = host.indexOf(':');
	if (host[0] != '[' && c >= 0 && host.indexOf(':', c + 1) > 0)
		thehost = '[' + host + ']';

	HostPort hp = parseHostPort(thehost);
	if (!hp.port.ok() && (hp.host.contains('/') || hp.host.contains('\\')))
	{
#ifdef ASL_SOCKET_LOCAL
		resize(sizeof(sockaddr_un));
		sockaddr_un* a=(sockaddr_un*)ptr();
		a->sun_family=AF_UNIX;
		memcpy(a->sun_path, *host, min((int)sizeof(a->sun_path), host.length() + 1));
		a->sun_path[sizeof(a->sun_path) - 1] = '\0';
		_type = LOCAL;
		return true;
#endif
	}
	return set(hp.host, hp.port);
}